

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t uprv_strCompare_63(UChar *s1,int32_t length1,UChar *s2,int32_t length2,UBool strncmpStyle,
                          UBool codePointOrder)

{
  uint uVar1;
  UChar *pUVar2;
  int iVar3;
  UChar *pUVar4;
  UChar UVar5;
  UChar UVar6;
  UChar *pUVar7;
  UChar *pUVar8;
  long lVar9;
  long lVar10;
  
  pUVar4 = s2;
  pUVar7 = s1;
  if ((length2 & length1) < 0) {
    if (s1 == s2) {
LAB_002c314e:
      uVar1 = 0;
    }
    else {
      pUVar8 = (UChar *)0x0;
      while( true ) {
        UVar5 = *pUVar7;
        UVar6 = *pUVar4;
        if (UVar5 != UVar6) break;
        if (UVar5 == L'\0') goto LAB_002c314e;
        pUVar7 = pUVar7 + 1;
        pUVar4 = pUVar4 + 1;
      }
      pUVar2 = (UChar *)0x0;
LAB_002c31dc:
      if (((codePointOrder != '\0') && (0xd7ff < (ushort)UVar5)) && (0xd7ff < (ushort)UVar6)) {
        if ((((0xdbff < (ushort)UVar5) || (pUVar7 + 1 == pUVar8)) ||
            ((pUVar7[1] & 0xfc00U) != 0xdc00)) &&
           ((pUVar7 == s1 || (UVar5 & 0xfc00U) != 0xdc00 || ((pUVar7[-1] & 0xfc00U) != 0xd800)))) {
          UVar5 = UVar5 + L'\xd800';
        }
        if ((((0xdbff < (ushort)UVar6) || (pUVar4 + 1 == pUVar2)) ||
            ((pUVar4[1] & 0xfc00U) != 0xdc00)) &&
           ((pUVar4 == s2 || (UVar6 & 0xfc00U) != 0xdc00 || ((pUVar4[-1] & 0xfc00U) != 0xd800)))) {
          UVar6 = UVar6 + L'\xd800';
        }
      }
      uVar1 = (uint)(ushort)UVar5 - (uint)(ushort)UVar6;
    }
  }
  else if (strncmpStyle == '\0') {
    if (length1 < 0) {
      length1 = u_strlen_63(s1);
    }
    if (length2 < 0) {
      length2 = u_strlen_63(s2);
    }
    iVar3 = length2;
    if (length1 < length2) {
      iVar3 = length1;
    }
    uVar1 = 0xffffffff;
    if (length2 <= length1) {
      uVar1 = (uint)(length1 != length2);
    }
    if (s1 != s2) {
      for (lVar10 = (long)iVar3 * 2; lVar10 != 0; lVar10 = lVar10 + -2) {
        UVar5 = *pUVar7;
        UVar6 = *pUVar4;
        if (UVar5 != UVar6) {
          pUVar8 = s1 + length1;
          pUVar2 = s2 + length2;
          goto LAB_002c31dc;
        }
        pUVar7 = pUVar7 + 1;
        pUVar4 = pUVar4 + 1;
      }
    }
  }
  else {
    uVar1 = 0;
    if (s1 != s2) {
      lVar9 = (long)length1;
      pUVar8 = s1 + lVar9;
      for (lVar10 = lVar9 * 2; lVar10 != 0; lVar10 = lVar10 + -2) {
        UVar5 = *pUVar7;
        UVar6 = *pUVar4;
        if (UVar5 != UVar6) {
          pUVar2 = s2 + lVar9;
          goto LAB_002c31dc;
        }
        if (UVar5 == L'\0') {
          return 0;
        }
        pUVar7 = pUVar7 + 1;
        pUVar4 = pUVar4 + 1;
      }
    }
  }
  return uVar1;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
uprv_strCompare(const UChar *s1, int32_t length1,
                const UChar *s2, int32_t length2,
                UBool strncmpStyle, UBool codePointOrder) {
    const UChar *start1, *start2, *limit1, *limit2;
    UChar c1, c2;

    /* setup for fix-up */
    start1=s1;
    start2=s2;

    /* compare identical prefixes - they do not need to be fixed up */
    if(length1<0 && length2<0) {
        /* strcmp style, both NUL-terminated */
        if(s1==s2) {
            return 0;
        }

        for(;;) {
            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=limit2=NULL;
    } else if(strncmpStyle) {
        /* special handling for strncmp, assume length1==length2>=0 but also check for NUL */
        if(s1==s2) {
            return 0;
        }

        limit1=start1+length1;

        for(;;) {
            /* both lengths are same, check only one limit */
            if(s1==limit1) {
                return 0;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit2=start2+length1; /* use length1 here, too, to enforce assumption */
    } else {
        /* memcmp/UnicodeString style, both length-specified */
        int32_t lengthResult;

        if(length1<0) {
            length1=u_strlen(s1);
        }
        if(length2<0) {
            length2=u_strlen(s2);
        }

        /* limit1=start1+min(lenght1, length2) */
        if(length1<length2) {
            lengthResult=-1;
            limit1=start1+length1;
        } else if(length1==length2) {
            lengthResult=0;
            limit1=start1+length1;
        } else /* length1>length2 */ {
            lengthResult=1;
            limit1=start1+length2;
        }

        if(s1==s2) {
            return lengthResult;
        }

        for(;;) {
            /* check pseudo-limit */
            if(s1==limit1) {
                return lengthResult;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=start1+length1;
        limit2=start2+length2;
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && (s1+1)!=limit1 && U16_IS_TRAIL(*(s1+1))) ||
            (U16_IS_TRAIL(c1) && start1!=s1 && U16_IS_LEAD(*(s1-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && (s2+1)!=limit2 && U16_IS_TRAIL(*(s2+1))) ||
            (U16_IS_TRAIL(c2) && start2!=s2 && U16_IS_LEAD(*(s2-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}